

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::MessageLite::CheckTypeAndMergeFrom(MessageLite *this,MessageLite *other)

{
  int iVar1;
  undefined4 extraout_var;
  ClassData **v1;
  ClassData **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  string_view sVar3;
  LogMessage local_48;
  Voidify local_31;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  ClassData *other_data;
  ClassData *data;
  MessageLite *other_local;
  MessageLite *this_local;
  
  data = (ClassData *)other;
  other_local = this;
  iVar1 = (*this->_vptr_MessageLite[4])();
  other_data = (ClassData *)CONCAT44(extraout_var,iVar1);
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)(*(code *)data->prototype[2]._vptr_MessageLite)();
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::internal::ClassData_const*>(&other_data);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::internal::ClassData_const*>
                 ((ClassData **)&absl_log_internal_check_op_result);
  local_30 = absl::lts_20250127::log_internal::
             Check_EQImpl<google::protobuf::internal::ClassData_const*,google::protobuf::internal::ClassData_const*>
                       (v1,v2,"data == other_data");
  if (local_30 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
               ,0x51,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_48);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [53])"Invalid call to CheckTypeAndMergeFrom between types "
                       );
    sVar3 = GetTypeName(this);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,sVar3);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,(char (*) [6])" and ");
    sVar3 = GetTypeName((MessageLite *)data);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,sVar3);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_31,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_48);
  }
  (*other_data->merge_to_from)(this,(MessageLite *)data);
  return;
}

Assistant:

void MessageLite::CheckTypeAndMergeFrom(const MessageLite& other) {
  auto* data = GetClassData();
  auto* other_data = other.GetClassData();

  ABSL_CHECK_EQ(data, other_data)
      << "Invalid call to CheckTypeAndMergeFrom between types " << GetTypeName()
      << " and " << other.GetTypeName();
  data->merge_to_from(*this, other);
}